

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

void __thiscall Corrade::Containers::Optional<long>::Optional(Optional<long> *this,long *value)

{
  type_conflict4 *ptVar1;
  long *value_local;
  Optional<long> *this_local;
  
  this->_set = true;
  ptVar1 = Utility::move<long&>(value);
  (this->field_0)._value = *ptVar1;
  return;
}

Assistant:

Optional(T&& value) noexcept(std::is_nothrow_move_constructible<T>::value): _set{true} {
            /* Can't use {}, see the GCC 4.8-specific overload for details */
            #if defined(CORRADE_TARGET_GCC) && !defined(CORRADE_TARGET_CLANG) && __GNUC__ < 5
            Implementation::construct(_value, Utility::move(value));
            #else
            new(&_value) T{Utility::move(value)};
            #endif
        }